

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O0

int rfftb1_(int *n,int *in,double *c__,double *ch,double *wa,double *fac)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *wa1;
  double *wa3;
  double *wa2;
  double *in_RCX;
  int iVar8;
  long in_RDX;
  double *in_RSI;
  int *in_RDI;
  long in_R8;
  long in_R9;
  double *in_stack_00000020;
  double *in_stack_00000028;
  double halfm;
  int *in_stack_00000038;
  int modn;
  double half;
  int *in_stack_00000048;
  int idl1;
  int ido;
  int ix4;
  int ix3;
  int ix2;
  int iw;
  int nl;
  int ip;
  int nf;
  int na;
  int l2;
  int l1;
  int k1;
  int j;
  int i__1;
  int c_offset;
  int c_dim1;
  undefined4 in_stack_ffffffffffffff60;
  double *ch_00;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  double *wa2_00;
  
  wa1 = (double *)(in_R8 + -8);
  iVar16 = *(int *)in_RSI;
  iVar1 = iVar16 + 1;
  wa3 = (double *)(in_RDX + (long)iVar1 * -8);
  wa2_00 = in_RCX + -1;
  wa2 = (double *)(in_R9 + -8);
  iVar2 = (int)*(double *)(in_R9 + 8);
  iVar10 = 0;
  for (iVar12 = 1; iVar12 <= iVar2; iVar12 = iVar12 + 1) {
    iVar10 = 1 - iVar10;
    if ((5 < (int)wa2[iVar12 + 2]) && (iVar12 != iVar2)) {
      iVar10 = 1 - iVar10;
    }
  }
  ch_00 = (double *)0x3fe0000000000000;
  iVar8 = *in_RDI % 2;
  iVar12 = *in_RDI + -2;
  if (iVar8 != 0) {
    iVar12 = *in_RDI + -1;
  }
  if (iVar10 == 0) {
    for (iVar14 = 2; iVar14 <= iVar12; iVar14 = iVar14 + 2) {
      wa3[iVar14 * iVar16 + 1] = wa3[iVar14 * iVar16 + 1] * 0.5;
      wa3[(iVar14 + 1) * iVar16 + 1] = wa3[(iVar14 + 1) * iVar16 + 1] * -0.5;
    }
  }
  else {
    *in_RCX = wa3[iVar16 + 1];
    wa2_00[*in_RDI] = wa3[*in_RDI * iVar16 + 1];
    for (iVar14 = 2; iVar14 <= iVar12; iVar14 = iVar14 + 2) {
      wa2_00[iVar14] = wa3[iVar14 * iVar16 + 1] * 0.5;
      wa2_00[iVar14 + 1] = wa3[(iVar14 + 1) * iVar16 + 1] * -0.5;
    }
  }
  iVar9 = 1;
  uVar11 = 1;
  iVar15 = iVar2;
  for (iVar13 = 1; iVar13 <= iVar15; iVar13 = iVar13 + 1) {
    iVar3 = (int)wa2[iVar13 + 2];
    uVar4 = iVar3 * uVar11;
    iVar5 = *in_RDI / (int)uVar4;
    iVar6 = iVar5 * uVar11;
    if (iVar3 == 4) {
      iVar7 = iVar9 + iVar5;
      in_stack_ffffffffffffff80 = iVar7 + iVar5;
      if (iVar10 == 0) {
        r1f4kb_((int *)CONCAT44(iVar12,iVar9),(int *)CONCAT44(iVar7,in_stack_ffffffffffffff80),
                (double *)CONCAT44(in_stack_ffffffffffffff7c,iVar5),
                (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),ch_00,
                (int *)CONCAT44(iVar8,in_stack_ffffffffffffff60),(double *)CONCAT44(iVar13,uVar11),
                (double *)CONCAT44(iVar15,iVar14),(double *)CONCAT44(iVar16,iVar1));
      }
      else {
        r1f4kb_((int *)CONCAT44(iVar12,iVar9),(int *)CONCAT44(iVar7,in_stack_ffffffffffffff80),
                (double *)CONCAT44(in_stack_ffffffffffffff7c,iVar5),
                (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),ch_00,
                (int *)CONCAT44(iVar8,in_stack_ffffffffffffff60),(double *)CONCAT44(iVar13,uVar11),
                (double *)CONCAT44(iVar15,iVar14),(double *)CONCAT44(iVar16,iVar1));
      }
      iVar10 = 1 - iVar10;
    }
    else if (iVar3 == 2) {
      if (iVar10 == 0) {
        r1f2kb_((int *)&stack0xffffffffffffff78,(int *)&stack0xffffffffffffffa0,wa3 + iVar1,
                (int *)in_RSI,wa2_00 + 1,&c__1,wa1 + iVar9);
      }
      else {
        r1f2kb_((int *)&stack0xffffffffffffff78,(int *)&stack0xffffffffffffffa0,wa2_00 + 1,&c__1,
                wa3 + iVar1,(int *)in_RSI,wa1 + iVar9);
      }
      iVar10 = 1 - iVar10;
    }
    else if (iVar3 == 3) {
      if (iVar10 == 0) {
        r1f3kb_((int *)((ulong)uVar4 << 0x20),(int *)CONCAT44(iVar2,3),
                (double *)CONCAT44(iVar12,iVar9),
                (int *)CONCAT44(iVar9 + iVar5,in_stack_ffffffffffffff80),
                (double *)CONCAT44(in_stack_ffffffffffffff7c,iVar5),
                (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),(double *)CONCAT44(iVar16,iVar1),
                wa2);
      }
      else {
        r1f3kb_((int *)CONCAT44(uVar4,iVar10),(int *)CONCAT44(iVar2,3),
                (double *)CONCAT44(iVar12,iVar9),
                (int *)CONCAT44(iVar9 + iVar5,in_stack_ffffffffffffff80),
                (double *)CONCAT44(in_stack_ffffffffffffff7c,iVar5),
                (int *)CONCAT44(iVar6,in_stack_ffffffffffffff70),(double *)CONCAT44(iVar16,iVar1),
                wa2);
      }
      iVar10 = 1 - iVar10;
    }
    else if (iVar3 == 5) {
      iVar6 = iVar9 + iVar5;
      in_stack_ffffffffffffff80 = iVar6 + iVar5;
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff80 + iVar5;
      if (iVar10 == 0) {
        r1f5kb_((int *)CONCAT44(iVar15,iVar14),(int *)CONCAT44(iVar13,uVar11),
                (double *)((ulong)uVar4 << 0x20),(int *)CONCAT44(iVar2,5),
                (double *)CONCAT44(iVar12,iVar9),(int *)CONCAT44(iVar6,in_stack_ffffffffffffff80),
                wa1,wa2_00,wa3,in_RSI);
      }
      else {
        r1f5kb_((int *)CONCAT44(iVar15,iVar14),(int *)CONCAT44(iVar13,uVar11),
                (double *)CONCAT44(uVar4,iVar10),(int *)CONCAT44(iVar2,5),
                (double *)CONCAT44(iVar12,iVar9),(int *)CONCAT44(iVar6,in_stack_ffffffffffffff80),
                wa1,wa2_00,wa3,in_RSI);
      }
      iVar10 = 1 - iVar10;
    }
    else {
      if (iVar10 == 0) {
        r1fgkb_(in_stack_00000048,(int *)half,in_stack_00000038,(int *)halfm,in_stack_00000028,
                in_stack_00000020,_iw,_ip,_na,_l1,_j,_c_offset);
      }
      else {
        r1fgkb_(in_stack_00000048,(int *)half,in_stack_00000038,(int *)halfm,in_stack_00000028,
                in_stack_00000020,_iw,_ip,_na,_l1,_j,_c_offset);
      }
      if (iVar5 == 1) {
        iVar10 = 1 - iVar10;
      }
    }
    iVar9 = (iVar3 + -1) * iVar5 + iVar9;
    uVar11 = uVar4;
  }
  return 0;
}

Assistant:

int rfftb1_(int *n, int *in, fft_real_t *c__, fft_real_t *ch,
	fft_real_t *wa, fft_real_t *fac)
{
    /* System generated locals */
    int c_dim1, c_offset, i__1;

    /* Local variables */
     int j, k1, l1, l2, na, nf, ip, nl, iw, ix2, ix3, ix4, ido,
	    idl1;
     fft_real_t half;
     int modn;
     fft_real_t halfm;
    extern /* Subroutine */ int r1f2kb_(int *, int *, fft_real_t *, int
	    *, fft_real_t *, int *, fft_real_t *), r1f4kb_(int *, int *, fft_real_t
	    *, int *, fft_real_t *, int *, fft_real_t *, fft_real_t *, fft_real_t *), r1f3kb_(
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , fft_real_t *), r1f5kb_(int *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, fft_real_t *, fft_real_t *, fft_real_t *, fft_real_t *), r1fgkb_(int *,
	    int *, int *, int *, fft_real_t *, fft_real_t *, fft_real_t *, int *
	    , fft_real_t *, fft_real_t *, int *, fft_real_t *);


    /* Parameter adjustments */
    --wa;
    c_dim1 = *in;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;
    --ch;
    --fac;

    /* Function Body */
    nf = fac[2];
    na = 0;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	na = 1 - na;
	if (ip <= 5) {
	    goto L10;
	}
	if (k1 == nf) {
	    goto L10;
	}
	na = 1 - na;
L10:
	;
    }
    half = .5;
    halfm = -.5;
    modn = *n % 2;
    nl = *n - 2;
    if (modn != 0) {
	nl = *n - 1;
    }
    if (na == 0) {
	goto L120;
    }
    ch[1] = c__[c_dim1 + 1];
    ch[*n] = c__[*n * c_dim1 + 1];
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	ch[j] = half * c__[j * c_dim1 + 1];
	ch[j + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L118: */
    }
    goto L124;
L120:
    i__1 = nl;
    for (j = 2; j <= i__1; j += 2) {
	c__[j * c_dim1 + 1] = half * c__[j * c_dim1 + 1];
	c__[(j + 1) * c_dim1 + 1] = halfm * c__[(j + 1) * c_dim1 + 1];
/* L122: */
    }
L124:
    l1 = 1;
    iw = 1;
    i__1 = nf;
    for (k1 = 1; k1 <= i__1; ++k1) {
	ip = fac[k1 + 2];
	l2 = ip * l1;
	ido = *n / l2;
	idl1 = ido * l1;
	if (ip != 4) {
	    goto L103;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	if (na != 0) {
	    goto L101;
	}
	r1f4kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3]);
	goto L102;
L101:
	r1f4kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3]);
L102:
	na = 1 - na;
	goto L115;
L103:
	if (ip != 2) {
	    goto L106;
	}
	if (na != 0) {
	    goto L104;
	}
	r1f2kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw]);
	goto L105;
L104:
	r1f2kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw]);
L105:
	na = 1 - na;
	goto L115;
L106:
	if (ip != 3) {
	    goto L109;
	}
	ix2 = iw + ido;
	if (na != 0) {
	    goto L107;
	}
	r1f3kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2]);
	goto L108;
L107:
	r1f3kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2]);
L108:
	na = 1 - na;
	goto L115;
L109:
	if (ip != 5) {
	    goto L112;
	}
	ix2 = iw + ido;
	ix3 = ix2 + ido;
	ix4 = ix3 + ido;
	if (na != 0) {
	    goto L110;
	}
	r1f5kb_(&ido, &l1, &c__[c_offset], in, &ch[1], &c__1, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
	goto L111;
L110:
	r1f5kb_(&ido, &l1, &ch[1], &c__1, &c__[c_offset], in, &wa[iw], &wa[
		ix2], &wa[ix3], &wa[ix4]);
L111:
	na = 1 - na;
	goto L115;
L112:
	if (na != 0) {
	    goto L113;
	}
	r1fgkb_(&ido, &ip, &l1, &idl1, &c__[c_offset], &c__[c_offset], &c__[
		c_offset], in, &ch[1], &ch[1], &c__1, &wa[iw]);
	goto L114;
L113:
	r1fgkb_(&ido, &ip, &l1, &idl1, &ch[1], &ch[1], &ch[1], &c__1, &c__[
		c_offset], &c__[c_offset], in, &wa[iw]);
L114:
	if (ido == 1) {
	    na = 1 - na;
	}
L115:
	l1 = l2;
	iw += (ip - 1) * ido;
/* L116: */
    }
    return 0;
}